

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_getshortstr_continue(TString *key,Node *n)

{
  int iVar1;
  TKey *pTVar2;
  TValue *k;
  Node *pNStack_20;
  int nx;
  Node *n_local;
  TString *key_local;
  
  pNStack_20 = n;
  while( true ) {
    do {
      iVar1 = (pNStack_20->i_key).nk.next;
      if (iVar1 == 0) {
        key_local = (TString *)&luaO_nilobject_;
        return (TValue *)key_local;
      }
      pNStack_20 = pNStack_20 + iVar1;
      pTVar2 = &pNStack_20->i_key;
    } while ((pNStack_20->i_key).nk.tt_ != 0x8004);
    if (((pNStack_20->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2a2,"const TValue *luaH_getshortstr_continue(TString *, Node *)");
    }
    if ((((pTVar2->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2a2,"const TValue *luaH_getshortstr_continue(TString *, Node *)");
    }
    if (((pTVar2->nk).value_.gc)->tt != '\x04') break;
    if (((pNStack_20->i_key).nk.tt_ & 0xf) != 4) {
      __assert_fail("(((((((k))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2a2,"const TValue *luaH_getshortstr_continue(TString *, Node *)");
    }
    if ((((pTVar2->nk).value_.gc)->tt & 0xf) != 4) {
      __assert_fail("(((((k)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                    ,0x2a2,"const TValue *luaH_getshortstr_continue(TString *, Node *)");
    }
    if ((TString *)(pTVar2->nk).value_.gc == key) {
      return &pNStack_20->i_val;
    }
  }
  __assert_fail("((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c\", 674, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c\", 674, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                ,0x2a2,"const TValue *luaH_getshortstr_continue(TString *, Node *)");
}

Assistant:

const TValue *luaH_getshortstr_continue(TString *key, Node *n) {
  for (;;) { /* check whether 'key' is somewhere in the chain starting from next node after n */
    int nx = gnext(n);
    if (nx == 0)
      return luaO_nilobject; /* not found */
    n += nx;
    const TValue *k = gkey(n);
    if (ttisshrstring(k) && eqshrstr(tsvalue(k), key))
      return gval(n); /* that's it */
  }
}